

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

int main(void)

{
  istream *piVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  int local_11c;
  int local_118;
  int j_2;
  int i_3;
  int j_1;
  vector<int,_std::allocator<int>_> lt;
  int cnt;
  pair<int,_int> tp;
  int tempdays;
  int noCanbetaken;
  int i_2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bkList;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> liblist;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mp;
  int totalLibrary;
  int time;
  int temp_1;
  int j;
  vector<int,_std::allocator<int>_> lists;
  int local_50;
  int shiplimit;
  int stime;
  int bk;
  int i_1;
  int local_38;
  int local_34;
  int temp;
  int i;
  vector<int,_std::allocator<int>_> booksScores;
  int d;
  int l;
  int b;
  
  l = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  std::ios::tie((ostream *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example.txt"
          ,"r",_stdin);
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example_output.txt"
          ,"w",_stdout);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&d);
  piVar1 = (istream *)
           std::istream::operator>>
                     (piVar1,(int *)((long)&booksScores.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage + 4));
  std::istream::operator>>
            (piVar1,(int *)&booksScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&temp);
  for (local_34 = 0; local_34 < d; local_34 = local_34 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_38);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&temp,&local_38);
  }
  for (stime = 0;
      stime < booksScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; stime = stime + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&shiplimit);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_50);
    std::istream::operator>>
              (piVar1,(int *)((long)&lists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&temp_1);
    for (time = 0; time < shiplimit; time = time + 1) {
      std::istream::operator>>((istream *)&std::cin,&totalLibrary);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&temp_1,&totalLibrary);
    }
    libraries[stime].libraryNo = stime;
    libraries[stime].noOfBooks = shiplimit;
    libraries[stime].signupProcess = local_50;
    libraries[stime].shipTime =
         lists.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
    std::vector<int,_std::allocator<int>_>::operator=
              (&libraries[stime].booksList,(vector<int,_std::allocator<int>_> *)&temp_1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&temp_1);
  }
  std::sort<library*,bool(*)(library,library)>
            (libraries,
             libraries +
             booksScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,compareTwoLibrary);
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (int)booksScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &liblist.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &bkList.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&noCanbetaken);
  tempdays = 0;
  while ((tempdays <
          booksScores.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ &&
         (-1 < mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ -
               libraries[tempdays].signupProcess))) {
    mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ -
         libraries[tempdays].signupProcess;
    mp._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         (int)mp._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&libraries[tempdays].booksList);
    tp.first = (int)(sVar2 / (ulong)(long)libraries[tempdays].shipTime);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&libraries[tempdays].booksList);
    if (sVar2 % (ulong)(long)libraries[tempdays].shipTime != 0) {
      tp.first = tp.first + 1;
    }
    if (mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < tp.first) {
      tp.second = mp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ *
                  libraries[tempdays].shipTime;
    }
    else {
      tp.second = tp.first * libraries[tempdays].shipTime;
    }
    std::pair<int,_int>::pair<int,_int,_true>
              ((pair<int,_int> *)
               ((long)&lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = libraries[tempdays].libraryNo;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &bkList.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               ((long)&lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_3);
    j_2 = 0;
    while ((sVar2 = std::vector<int,_std::allocator<int>_>::size(&libraries[tempdays].booksList),
           (ulong)(long)j_2 < sVar2 &&
           ((int)lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage < tp.second))) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&libraries[tempdays].booksList,(long)j_2);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&i_3,pvVar3);
      j_2 = j_2 + 1;
      lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)lt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&noCanbetaken,(value_type *)&i_3);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_3);
    tempdays = tempdays + 1;
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(int)mp._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_118 = 0;
      sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &bkList.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)(long)local_118 < sVar2; local_118 = local_118 + 1) {
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &bkList.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_118);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pvVar5->first);
    poVar4 = std::operator<<(poVar4," ");
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&noCanbetaken,(long)local_118);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_11c = 0;
    while( true ) {
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&noCanbetaken,(long)local_118);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar2 <= (ulong)(long)local_11c) break;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&noCanbetaken,(long)local_118);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_11c);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
      std::operator<<(poVar4," ");
      local_11c = local_11c + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  fclose(_stdin);
  fclose(_stdout);
  l = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&noCanbetaken);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &bkList.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &liblist.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&temp);
  return l;
}

Assistant:

int main()
{
    sync;
    inputa;
    outputa;
   /* inputb;
    outputb;
    inputc;
    outputc;
   inputd;
    outputd;
    inpute;
    outpute;
   inputf;
    outputf;*/

    int b, l, d;
    cin>>b>>l>>d;

    vector<int> booksScores;
    for(int i=0;i<b;i++)
    {
        int temp;
        cin>>temp;
        booksScores.push_back(temp);
    }
    for(int i=0;i<l;i++)
    {
        int bk, stime,shiplimit;
        cin>>bk>>stime>>shiplimit;
        vector<int> lists;
        for(int j=0;j<bk;j++)
        {
            int temp;
            cin>>temp;
            lists.push_back(temp);
        }
        libraries[i].libraryNo = i;
        libraries[i].noOfBooks= bk;
        libraries[i].signupProcess = stime;
        libraries[i].shipTime = shiplimit;
        libraries[i].booksList=lists;
    }
    sort(libraries, libraries+l, compareTwoLibrary);
    int time = d;
    int totalLibrary = 0;
    map<int,int> mp;
    vector<pair<int,int>> liblist;
    vector<vector<int>> bkList;
    for(int i=0;i<l;i++)
    {
        if(time - libraries[i].signupProcess >= 0)
            time -= libraries[i].signupProcess;
        else break;

        totalLibrary++;
        int noCanbetaken = 0;
        int tempdays = libraries[i].booksList.size() / libraries[i].shipTime;
        if (libraries[i].booksList.size() % libraries[i].shipTime !=0)
            tempdays += 1;
        if(tempdays > time)
        {
            noCanbetaken = time * libraries[i].shipTime;
        } else
        {
            noCanbetaken =((tempdays) * libraries[i].shipTime);
        }
        pair<int,int> tp;
        tp.first = libraries[i].libraryNo;
        tp.second = noCanbetaken;
        liblist.push_back(tp);
        int cnt = 0;
        vector<int> lt;
        for(int j=0;j<libraries[i].booksList.size();j++,cnt++)
        {
            if(cnt >= noCanbetaken) break;
            /*if(mp[libraries[i].booksList[j]] == 0)
            {
                mp[libraries[i].booksList[j]] = 1;

            }*/
            lt.push_back(libraries[i].booksList[j]);
        }
        bkList.push_back(lt);

    }
    cout<<totalLibrary<<endl;
    for(int i=0;i<liblist.size();i++)
    {
        cout<<liblist[i].first<<" "<<bkList[i].size()<<endl;
        for(int j=0;j<bkList[i].size();j++)
        {
            cout<<bkList[i][j]<<" ";
        }
        cout<<endl;
    }
    cout<<endl;
    fclose(stdin);
    fclose(stdout);
    return 0;
}